

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool build_vault(chunk *c,loc_conflict centre,vault *v)

{
  bitflag *flags;
  byte bVar1;
  byte bVar2;
  char cVar3;
  _Bool _Var4;
  uint32_t uVar5;
  wchar_t wVar6;
  square *psVar7;
  ushort **ppuVar8;
  long lVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  bitflag *flags_00;
  _Bool great;
  char *pcVar15;
  wchar_t wVar16;
  wchar_t y1;
  wchar_t y1_00;
  char *pcVar19;
  loc_conflict grid;
  _Bool reflect;
  wchar_t local_a4;
  wchar_t twid;
  wchar_t rotate;
  loc_conflict centre_local;
  int local_90;
  wchar_t thgt;
  char *local_80;
  wchar_t local_78;
  wchar_t local_74;
  ulong local_70;
  ulong local_68;
  vault *local_60;
  char racial_symbol [30];
  ulong uVar17;
  ulong uVar18;
  
  local_80 = v->text;
  racial_symbol[0x10] = '\0';
  racial_symbol[0x11] = '\0';
  racial_symbol[0x12] = '\0';
  racial_symbol[0x13] = '\0';
  racial_symbol[0x14] = '\0';
  racial_symbol[0x15] = '\0';
  racial_symbol[0x16] = '\0';
  racial_symbol[0x17] = '\0';
  racial_symbol[0x18] = '\0';
  racial_symbol[0x19] = '\0';
  racial_symbol[0x1a] = '\0';
  racial_symbol[0x1b] = '\0';
  racial_symbol[0x1c] = '\0';
  racial_symbol[0x1d] = '\0';
  racial_symbol[0] = '\0';
  racial_symbol[1] = '\0';
  racial_symbol[2] = '\0';
  racial_symbol[3] = '\0';
  racial_symbol[4] = '\0';
  racial_symbol[5] = '\0';
  racial_symbol[6] = '\0';
  racial_symbol[7] = '\0';
  racial_symbol[8] = '\0';
  racial_symbol[9] = '\0';
  racial_symbol[10] = '\0';
  racial_symbol[0xb] = '\0';
  racial_symbol[0xc] = '\0';
  racial_symbol[0xd] = '\0';
  racial_symbol[0xe] = '\0';
  racial_symbol[0xf] = '\0';
  centre_local = centre;
  if (c == (chunk *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                  ,0x566,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
  }
  event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,v->name);
  if ((centre.y < c->height) && (centre.x < c->width)) {
    get_random_symmetry_transform
              ((uint)v->hgt,(uint)v->wid,L'\0',L'\0',&rotate,&reflect,&thgt,&twid);
    if ((thgt != (uint)v->hgt) || (twid != (uint)v->wid)) {
      __assert_fail("v->hgt == thgt && v->wid == twid",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                    ,0x576,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
    }
    event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,(uint)v->hgt + L'\x02',(uint)v->wid + L'\x02');
    centre_local.y = centre.y;
  }
  else {
    bVar2 = v->hgt;
    bVar1 = v->wid;
    wVar16 = calc_default_transpose_weight((uint)bVar2,(uint)bVar1);
    get_random_symmetry_transform((uint)bVar2,(uint)bVar1,L'\0',wVar16,&rotate,&reflect,&thgt,&twid)
    ;
    event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,thgt + L'\x02',twid + L'\x02');
    _Var4 = find_space(&centre_local,thgt + L'\x02',twid + L'\x02');
    if (!_Var4) {
      return false;
    }
    centre = (loc_conflict)((ulong)centre_local & 0xffffffff);
  }
  wVar16 = twid / -2 + centre.x;
  uVar17 = (ulong)(uint)wVar16;
  y1 = thgt / -2 + centre_local.y;
  uVar18 = (ulong)(uint)y1;
  centre_local.y = y1;
  centre_local.x = wVar16;
  local_74 = thgt + y1 + L'\xffffffff';
  local_78 = twid + L'\xffffffff' + wVar16;
  generate_mark(c,y1,wVar16,local_74,local_78,L'\x0e');
  flags = v->flags;
  uVar14 = 0;
  local_70 = uVar17;
  local_68 = uVar18;
  local_60 = v;
  for (pcVar19 = local_80; (bVar2 = v->hgt, uVar14 < bVar2 && (*pcVar19 != '\0'));
      pcVar19 = pcVar19 + lVar13) {
    for (lVar13 = 0; ((uint)lVar13 < (uint)v->wid && (pcVar19[lVar13] != '\0')); lVar13 = lVar13 + 1
        ) {
      grid = loc((uint)lVar13,uVar14);
      symmetry_transform(&grid,(wchar_t)uVar18,(wchar_t)uVar17,(uint)v->hgt,(uint)v->wid,rotate,
                         reflect);
      if ((grid.x < (wchar_t)uVar17) ||
         (((wVar16 + twid <= grid.x || (grid.y < (wchar_t)uVar18)) || (thgt + y1 <= grid.y)))) {
        __assert_fail("grid.x >= x1 && grid.x <= x2 && grid.y >= y1 && grid.y <= y2",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                      ,0x590,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
      }
      if (pcVar19[lVar13] == ' ') goto LAB_0014cd0d;
      square_set_feat((chunk_conflict *)c,(loc)grid,L'\x01');
      _Var4 = square_isempty((chunk_conflict *)c,(loc)grid);
      if (!_Var4) {
        __assert_fail("square_isempty(c, grid)",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                      ,0x599,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
      }
      cVar3 = pcVar19[lVar13];
      switch(cVar3) {
      case '#':
        set_marked_granite(c,grid,L'\r');
        break;
      case '$':
      case '\'':
      case '(':
      case ')':
        break;
      case '%':
        set_marked_granite(c,grid,L'\f');
        _Var4 = flag_has_dbg(flags,1,1,"v->flags","ROOMF_FEW_ENTRANCES");
        if (_Var4) {
          append_entrance(grid);
        }
        psVar7 = square((chunk_conflict *)c,(loc)grid);
        flags_00 = psVar7->info;
        iVar12 = 4;
        pcVar15 = "SQUARE_ROOM";
        goto LAB_0014ccf6;
      case '&':
        uVar5 = Rand_div(100);
        if ((int)uVar5 < 0x4b) {
          place_object((chunk_conflict *)c,grid,c->depth,false,false,'\x05',L'\0');
        }
        else {
LAB_0014cbed:
          uVar5 = Rand_div(4);
          if (uVar5 == 0) {
            place_trap(c,(loc)grid,L'\xffffffff',c->depth);
          }
        }
        break;
      case '*':
        uVar5 = Rand_div(2);
        wVar10 = L'\x14' - (uint)(uVar5 == 0);
        goto LAB_0014cc9a;
      case '+':
        place_secret_door((chunk_conflict *)c,grid);
        break;
      default:
        switch(cVar3) {
        case ':':
          uVar5 = Rand_div(2);
          wVar10 = (uint)(uVar5 == 0) * 8 + L'\x10';
          goto LAB_0014cc9a;
        case ';':
        case '=':
        case '?':
          break;
        case '<':
          if (dun->persist == false) {
LAB_0014cc7f:
            wVar10 = L'\x05';
            goto LAB_0014cc9a;
          }
          break;
        case '>':
          if (dun->persist == false) {
            if ((dun->quest != false) || ((uint)z_info->max_depth + L'\xffffffff' <= c->depth))
            goto LAB_0014cc7f;
            wVar10 = L'\x06';
            goto LAB_0014cc9a;
          }
          break;
        case '@':
          wVar10 = L'\x16';
LAB_0014cc9a:
          square_set_feat((chunk_conflict *)c,(loc)grid,wVar10);
          break;
        default:
          if (cVar3 == '^') goto LAB_0014cbed;
          if (cVar3 == '`') {
            wVar10 = L'\x17';
            goto LAB_0014cc9a;
          }
        }
      }
      psVar7 = square((chunk_conflict *)c,(loc)grid);
      flag_on_dbg(psVar7->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
      psVar7 = square((chunk_conflict *)c,(loc)grid);
      flags_00 = psVar7->info;
      iVar12 = 3;
      pcVar15 = "SQUARE_VAULT";
LAB_0014ccf6:
      flag_on_dbg(flags_00,3,iVar12,"square(c, grid)->info",pcVar15);
      uVar17 = local_70;
      uVar18 = local_68;
      v = local_60;
LAB_0014cd0d:
    }
    uVar14 = uVar14 + 1;
  }
  uVar14 = 0;
  local_90 = 0;
  pcVar19 = local_80;
  do {
    y1_00 = (wchar_t)uVar18;
    wVar10 = (wchar_t)uVar17;
    if ((bVar2 <= uVar14) || (*pcVar19 == '\0')) {
      get_vault_monsters(c,racial_symbol,v->typ,local_80,y1_00,local_74,wVar10,local_78);
      return true;
    }
    for (lVar13 = 0; ((uint)lVar13 < (uint)v->wid && (pcVar19[lVar13] != '\0')); lVar13 = lVar13 + 1
        ) {
      grid = loc((uint)lVar13,uVar14);
      symmetry_transform(&grid,y1_00,wVar10,(uint)v->hgt,(uint)v->wid,rotate,reflect);
      if ((grid.x < wVar10) ||
         (((wVar16 + twid <= grid.x || (grid.y < y1_00)) || (thgt + y1 <= grid.y)))) {
        __assert_fail("grid.x >= x1 && grid.x <= x2 && grid.y >= y1 && grid.y <= y2",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                      ,0x5f1,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
      }
      bVar2 = pcVar19[lVar13];
      iVar12 = (int)(char)bVar2;
      if (iVar12 == 0x20) goto switchD_0014ce49_caseD_25;
      ppuVar8 = __ctype_b_loc();
      if (((bVar2 & 0xdf) != 0x58) && (((*ppuVar8)[iVar12] & 0x400) != 0)) {
        pcVar15 = strchr(racial_symbol,iVar12);
        if (local_90 < 0x1e && pcVar15 == (char *)0x0) {
          lVar9 = (long)local_90;
          local_90 = local_90 + 1;
          racial_symbol[lVar9] = bVar2;
        }
        goto switchD_0014ce49_caseD_25;
      }
      switch(bVar2) {
      case 0x21:
        wVar11 = c->depth + L'\x03';
        uVar5 = Rand_div(4);
        _Var4 = uVar5 == 0;
        wVar6 = L'\x1a';
        break;
      case 0x22:
        wVar11 = c->depth + L'\x03';
        uVar5 = Rand_div(4);
        _Var4 = uVar5 == 0;
        wVar6 = L'\x14';
        break;
      case 0x23:
        _Var4 = square_isroom((chunk_conflict *)c,(loc)grid);
        if (((!_Var4) || (_Var4 = square_isvault((chunk_conflict *)c,(loc)grid), !_Var4)) ||
           (_Var4 = square_isgranite((chunk_conflict *)c,(loc)grid), !_Var4)) {
LAB_0014d455:
          __assert_fail("square_isroom(c, grid) && square_isvault(c, grid) && square_isgranite(c, grid) && sqinfo_has(square(c, grid)->info, SQUARE_WALL_SOLID)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                        ,0x681,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
        }
        psVar7 = square((chunk_conflict *)c,(loc)grid);
        _Var4 = flag_has_dbg(psVar7->info,3,0xd,"square(c, grid)->info","SQUARE_WALL_SOLID");
        if (!_Var4) goto LAB_0014d455;
        wVar6 = count_neighbors((loc *)0x0,(chunk_conflict *)c,(loc)grid,square_isroom,false);
        if (wVar6 == L'\b') {
          psVar7 = square((chunk_conflict *)c,(loc)grid);
          flag_off(psVar7->info,3,0xd);
          goto LAB_0014d23f;
        }
        goto switchD_0014ce49_caseD_25;
      case 0x24:
        place_gold((chunk_conflict *)c,grid,c->depth,'\x05');
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2b:
      case 0x2e:
      case 0x2f:
      case 0x3a:
      case 0x3b:
      case 0x3c:
      case 0x3e:
        goto switchD_0014ce49_caseD_25;
      case 0x2c:
        wVar11 = c->depth + L'\x03';
        uVar5 = Rand_div(4);
        _Var4 = uVar5 == 0;
        wVar6 = L'\x1c';
        break;
      case 0x2d:
        local_a4 = c->depth + L'\x03';
        uVar5 = Rand_div(4);
        _Var4 = uVar5 == 0;
        uVar5 = Rand_div(2);
        wVar6 = L'\x18' - (uint)(uVar5 == 0);
        wVar11 = local_a4;
        break;
      case 0x30:
        wVar6 = c->depth + L'\x14';
        goto LAB_0014d351;
      case 0x31:
        uVar5 = Rand_div(2);
        if (uVar5 == 0) {
          wVar6 = c->depth;
          goto LAB_0014d351;
        }
        uVar5 = Rand_div(2);
        if (uVar5 == 0) {
          local_a4 = c->depth;
          uVar5 = Rand_div(8);
          _Var4 = uVar5 == 0;
          wVar6 = L'\0';
          wVar11 = local_a4;
          break;
        }
        uVar5 = Rand_div(4);
        if (uVar5 == 0) {
          place_trap(c,(loc)grid,L'\xffffffff',c->depth);
        }
        goto switchD_0014ce49_caseD_25;
      case 0x32:
        wVar6 = c->depth + L'\x05';
        goto LAB_0014d351;
      case 0x33:
        wVar11 = c->depth + L'\x03';
        goto LAB_0014d279;
      case 0x34:
        uVar5 = Rand_div(2);
        if (uVar5 == 0) {
          pick_and_place_monster(c,grid,c->depth + L'\x03',true,true,'\r');
        }
        uVar5 = Rand_div(2);
        if (uVar5 == 0) goto switchD_0014ce49_caseD_35;
        goto switchD_0014ce49_caseD_25;
      case 0x35:
switchD_0014ce49_caseD_35:
        wVar11 = c->depth + L'\a';
        goto LAB_0014d279;
      case 0x36:
        wVar6 = c->depth + L'\v';
LAB_0014d351:
        pick_and_place_monster(c,grid,wVar6,true,true,'\r');
        goto switchD_0014ce49_caseD_25;
      case 0x37:
        wVar11 = c->depth + L'\x0f';
LAB_0014d279:
        wVar6 = L'\0';
        _Var4 = false;
        break;
      case 0x38:
        pick_and_place_monster(c,grid,c->depth + L'(',true,true,'\r');
        wVar11 = c->depth + L'\x14';
        wVar6 = L'\0';
        _Var4 = true;
        great = _Var4;
        goto LAB_0014d2c5;
      case 0x39:
        pick_and_place_monster(c,grid,c->depth + L'\t',true,true,'\r');
        wVar11 = c->depth + L'\a';
        wVar6 = L'\0';
LAB_0014d2bf:
        _Var4 = true;
        break;
      case 0x3d:
        wVar11 = c->depth + L'\x03';
        uVar5 = Rand_div(4);
        _Var4 = uVar5 == 0;
        wVar6 = L'\x15';
        break;
      case 0x3f:
        wVar11 = c->depth + L'\x03';
        uVar5 = Rand_div(4);
        _Var4 = uVar5 == 0;
        wVar6 = L'\x19';
        break;
      case 0x40:
        _Var4 = square_isroom((chunk_conflict *)c,(loc)grid);
        if (((!_Var4) || (_Var4 = square_isvault((chunk_conflict *)c,(loc)grid), !_Var4)) ||
           (_Var4 = square_isperm((chunk_conflict *)c,(loc)grid), !_Var4)) {
          __assert_fail("square_isroom(c, grid) && square_isvault(c, grid) && square_isperm(c, grid)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                        ,0x695,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
        }
        wVar6 = count_neighbors((loc *)0x0,(chunk_conflict *)c,(loc)grid,square_isroom,false);
        if (wVar6 == L'\b') {
LAB_0014d23f:
          psVar7 = square((chunk_conflict *)c,(loc)grid);
          flag_on_dbg(psVar7->info,3,0xb,"square(c, grid)->info","SQUARE_WALL_INNER");
        }
        goto switchD_0014ce49_caseD_25;
      default:
        if (bVar2 == 0x5d) {
          uVar5 = Rand_div(3);
          uVar5 = Rand_div((uVar5 == 0) + 8);
          wVar6 = uVar5 + L'\n';
          if (8 < uVar5) {
            wVar6 = L'\0';
          }
          wVar11 = c->depth + L'\x03';
          goto LAB_0014d2bf;
        }
        if (bVar2 == 0x5f) {
          wVar11 = c->depth + L'\x03';
          uVar5 = Rand_div(4);
          _Var4 = uVar5 == 0;
          wVar6 = L'\x16';
LAB_0014d338:
          place_object((chunk_conflict *)c,grid,wVar11,_Var4,false,'\x05',wVar6);
        }
        else {
          if (bVar2 == 0x7c) {
            uVar5 = Rand_div(4);
            wVar6 = L'\0';
            if (uVar5 < 4) {
              wVar6 = *(wchar_t *)(&DAT_0024d594 + (ulong)uVar5 * 4);
            }
            wVar11 = c->depth + L'\x03';
            _Var4 = true;
            goto LAB_0014d338;
          }
          if (bVar2 == 0x7e) {
            wVar11 = c->depth + L'\x05';
            wVar6 = L'\x01';
            _Var4 = false;
            goto LAB_0014d338;
          }
        }
        goto LAB_0014d36d;
      }
      great = false;
LAB_0014d2c5:
      place_object((chunk_conflict *)c,grid,wVar11,_Var4,great,'\x05',wVar6);
switchD_0014ce49_caseD_25:
LAB_0014d36d:
    }
    uVar14 = uVar14 + 1;
    bVar2 = v->hgt;
    pcVar19 = pcVar19 + lVar13;
  } while( true );
}

Assistant:

bool build_vault(struct chunk *c, struct loc centre, struct vault *v)
{
	const char *data = v->text;
	int y1, x1, y2, x2;
	int x, y, races_local = 0;
	const char *t;
	char racial_symbol[30] = "";
	bool icky;
	int rotate, thgt, twid;
	bool reflect;

	assert(c);

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, v->name);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		get_random_symmetry_transform(v->hgt, v->wid, SYMTR_FLAG_NONE,
			calc_default_transpose_weight(v->hgt, v->wid),
			&rotate, &reflect, &thgt, &twid);
		event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
			thgt + 2, twid + 2);
		if (!find_space(&centre, thgt + 2, twid + 2))
			return (false);
	} else {
		/* Given the preset centre, don't allow transposition. */
		get_random_symmetry_transform(v->hgt, v->wid, SYMTR_FLAG_NONE,
			0, &rotate, &reflect, &thgt, &twid);
		assert(v->hgt == thgt && v->wid == twid);
		event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
			thgt + 2, twid + 2);
	}

	/* Convert centre to translation for the symmetry transformation. */
	centre.x -= twid / 2;
	centre.y -= thgt / 2;

	/* Get the room corners */
	y1 = centre.y;
	x1 = centre.x;
	y2 = y1 + thgt - 1;
	x2 = x1 + twid - 1;

	/* No random monsters in vaults. */
	generate_mark(c, y1, x1, y2, x2, SQUARE_MON_RESTRICT);

	/* Place dungeon features and objects */
	for (t = data, y = 0; y < v->hgt && *t; y++) {
		for (x = 0; x < v->wid && *t; x++, t++) {
			struct loc grid = loc(x, y);

			symmetry_transform(&grid, centre.y, centre.x, v->hgt,
				v->wid, rotate, reflect);
			assert(grid.x >= x1 && grid.x <= x2 &&
				grid.y >= y1 && grid.y <= y2);

			/* Skip non-grids */
			if (*t == ' ') continue;

			/* Lay down a floor */
			square_set_feat(c, grid, FEAT_FLOOR);

			/* Debugging assertion */
			assert(square_isempty(c, grid));

			/* By default vault squares are marked icky */
			icky = true;

			/* Analyze the grid */
			switch (*t) {
			case '%': {
				/* In this case, the square isn't really part
				 * of the vault, but rather is part of the
				 * "door step" to the vault. We don't mark it
				 * icky so that the tunneling code knows it's
				 * allowed to remove this wall. */
				set_marked_granite(c, grid, SQUARE_WALL_OUTER);
				if (roomf_has(v->flags, ROOMF_FEW_ENTRANCES)) {
					append_entrance(grid);
				}
				icky = false;
				break;
			}
				/* Inner or non-tunnelable outside granite wall */
			case '#': set_marked_granite(c, grid, SQUARE_WALL_SOLID); break;
				/* Permanent wall */
			case '@': square_set_feat(c, grid, FEAT_PERM); break;
				/* Gold seam */
			case '*': {
				square_set_feat(c, grid, one_in_(2) ? FEAT_MAGMA_K :
								FEAT_QUARTZ_K);
				break;
			}
				/* Rubble */
			case ':': {
				square_set_feat(c, grid, one_in_(2) ? FEAT_PASS_RUBBLE :
								FEAT_RUBBLE);
				break;
			}
				/* Secret door */
			case '+': place_secret_door(c, grid); break;
				/* Trap */
			case '^': if (one_in_(4)) place_trap(c, grid, -1, c->depth); break;
				/* Treasure or a trap */
			case '&': {
				if (randint0(100) < 75) {
					place_object(c, grid, c->depth, false, false, ORIGIN_VAULT,
								 0);
				} else if (one_in_(4)) {
					place_trap(c, grid, -1, c->depth);
				}
				break;
			}
				/* Stairs */
			case '<': {
				if (dun->persist) break;
				square_set_feat(c, grid, FEAT_LESS); break;
			}
			case '>': {
				if (dun->persist) break;
				/* No down stairs at bottom or on quests */
				if (dun->quest || c->depth
						>= z_info->max_depth - 1) {
					square_set_feat(c, grid, FEAT_LESS);
				} else {
					square_set_feat(c, grid, FEAT_MORE);
				}
				break;
			}
				/* Lava */
			case '`': square_set_feat(c, grid, FEAT_LAVA); break;
				/* Included to allow simple inclusion of FA vaults */
			case '/': /*square_set_feat(c, grid, FEAT_WATER)*/; break;
			case ';': /*square_set_feat(c, grid, FEAT_TREE)*/; break;
			}

			/* Part of a vault */
			sqinfo_on(square(c, grid)->info, SQUARE_ROOM);
			if (icky) sqinfo_on(square(c, grid)->info, SQUARE_VAULT);
		}
	}


	/* Place regular dungeon monsters and objects, convert inner walls */
	for (t = data, y = 0; y < v->hgt && *t; y++) {
		for (x = 0; x < v->wid && *t; x++, t++) {
			struct loc grid = loc(x, y);

			symmetry_transform(&grid, centre.y, centre.x, v->hgt,
				v->wid, rotate, reflect);
			assert(grid.x >= x1 && grid.x <= x2 &&
				grid.y >= y1 && grid.y <= y2);

			/* Hack -- skip "non-grids" */
			if (*t == ' ') continue;

			/* Most alphabetic characters signify monster races. */
			if (isalpha(*t) && (*t != 'x') && (*t != 'X')) {
				/* If the symbol is not yet stored, ... */
				if (!strchr(racial_symbol, *t)) {
					/* ... store it for later processing. */
					if (races_local < 30)
						racial_symbol[races_local++] = *t;
				}
			}

			/* Otherwise, analyze the symbol */
			else
				switch (*t) {
					/* An ordinary monster, object (sometimes good), or trap. */
				case '1': {
					if (one_in_(2)) {
						pick_and_place_monster(c, grid, c->depth , true, true,
											   ORIGIN_DROP_VAULT);
					} else if (one_in_(2)) {
						place_object(c, grid, c->depth,
									 one_in_(8) ? true : false, false,
									 ORIGIN_VAULT, 0);
					} else if (one_in_(4)) {
						place_trap(c, grid, -1, c->depth);
					}
					break;
				}
					/* Slightly out of depth monster. */
				case '2': pick_and_place_monster(c, grid, c->depth + 5, true,
												 true, ORIGIN_DROP_VAULT);
					break;
					/* Slightly out of depth object. */
				case '3': place_object(c, grid, c->depth + 3, false, false, 
									   ORIGIN_VAULT, 0); break;
					/* Monster and/or object */
				case '4': {
					if (one_in_(2))
						pick_and_place_monster(c, grid, c->depth + 3, true, 
											   true, ORIGIN_DROP_VAULT);
					if (one_in_(2))
						place_object(c, grid, c->depth + 7, false, false,
									 ORIGIN_VAULT, 0);
					break;
				}
					/* Out of depth object. */
				case '5': place_object(c, grid, c->depth + 7, false, false,
									   ORIGIN_VAULT, 0); break;
					/* Out of depth monster. */
				case '6': pick_and_place_monster(c, grid, c->depth + 11, true,
												 true, ORIGIN_DROP_VAULT);
					break;
					/* Very out of depth object. */
				case '7': place_object(c, grid, c->depth + 15, false, false,
									   ORIGIN_VAULT, 0); break;
					/* Very out of depth monster. */
				case '0': pick_and_place_monster(c, grid, c->depth + 20, true,
												 true, ORIGIN_DROP_VAULT);
					break;
					/* Meaner monster, plus treasure */
				case '9': {
					pick_and_place_monster(c, grid, c->depth + 9, true, true,
										   ORIGIN_DROP_VAULT);
					place_object(c, grid, c->depth + 7, true, false,
								 ORIGIN_VAULT, 0);
					break;
				}
					/* Nasty monster and treasure */
				case '8': {
					pick_and_place_monster(c, grid, c->depth + 40, true, true,
										   ORIGIN_DROP_VAULT);
					place_object(c, grid, c->depth + 20, true, true,
								 ORIGIN_VAULT, 0);
					break;
				}
					/* A chest. */
				case '~': place_object(c, grid, c->depth + 5, false, false,
									   ORIGIN_VAULT, TV_CHEST); break;
					/* Treasure. */
				case '$': place_gold(c, grid, c->depth, ORIGIN_VAULT);break;
					/* Armour. */
				case ']': {
					int	tval = 0, temp = one_in_(3) ? randint1(9) : randint1(8);
					switch (temp) {
					case 1: tval = TV_BOOTS; break;
					case 2: tval = TV_GLOVES; break;
					case 3: tval = TV_HELM; break;
					case 4: tval = TV_CROWN; break;
					case 5: tval = TV_SHIELD; break;
					case 6: tval = TV_CLOAK; break;
					case 7: tval = TV_SOFT_ARMOR; break;
					case 8: tval = TV_HARD_ARMOR; break;
					case 9: tval = TV_DRAG_ARMOR; break;
					}
					place_object(c, grid, c->depth + 3, true, false,
								 ORIGIN_VAULT, tval);
					break;
				}
					/* Weapon. */
				case '|': {
					int	tval = 0, temp = randint1(4);
					switch (temp) {
					case 1: tval = TV_SWORD; break;
					case 2: tval = TV_POLEARM; break;
					case 3: tval = TV_HAFTED; break;
					case 4: tval = TV_BOW; break;
					}
					place_object(c, grid, c->depth + 3, true, false,
								 ORIGIN_VAULT, tval);
					break;
				}
					/* Ring. */
				case '=': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_RING); break;
					/* Amulet. */
				case '"': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_AMULET); break;
					/* Potion. */
				case '!': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_POTION); break;
					/* Scroll. */
				case '?': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_SCROLL); break;
					/* Staff. */
				case '_': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_STAFF); break;
					/* Wand or rod. */
				case '-': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT,
									   one_in_(2) ? TV_WAND : TV_ROD);
					break;
					/* Food or mushroom. */
				case ',': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_FOOD); break;
					/* Inner or non-tunnelable outside granite wall */
				case '#': {
					/* Check consistency with first pass. */
					assert(square_isroom(c, grid) &&
						square_isvault(c, grid) &&
						square_isgranite(c, grid) &&
						sqinfo_has(square(c, grid)->info, SQUARE_WALL_SOLID));
					/*
					 * Convert to SQUARE_WALL_INNER if it
					 * does not touch the outside of the
					 * vault.
					 */
					if (count_neighbors(NULL, c, grid,
							square_isroom, false) == 8) {
						sqinfo_off(square(c, grid)->info,
							SQUARE_WALL_SOLID);
						sqinfo_on(square(c, grid)->info,
							SQUARE_WALL_INNER);
					}
					break;
				}
					/* Permanent wall */
				case '@': {
					/* Check consistency with first pass. */
					assert(square_isroom(c, grid) &&
						square_isvault(c, grid) &&
						square_isperm(c, grid));
					/*
					 * Mark as SQUARE_WALL_INNER if it does
					 * not touch the outside of the vault.
					 */
					if (count_neighbors(NULL, c, grid,
							square_isroom, false) == 8) {
						sqinfo_on(square(c, grid)->info,
							SQUARE_WALL_INNER);
					}
					break;
				}
				}
		}
	}

	/* Place specified monsters */
	get_vault_monsters(c, racial_symbol, v->typ, data, y1, y2, x1, x2);

	return true;
}